

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossfactorstocsv.cpp
# Opt level: O2

void lossfactorstocsv::DoIt(void)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  amplification_factor af;
  event_count ec;
  
  ReadOpts();
  fwrite("event_id,amplification_id,factor\n",0x21,1,_stdout);
  do {
    sVar2 = fread(&ec,8,1,_stdin);
    iVar1 = ec.event_id;
    iVar3 = ec.count;
    if (sVar2 == 0) {
      return;
    }
    while (iVar3 != 0) {
      sVar2 = fread(&af,8,1,_stdin);
      if (sVar2 == 0) {
        fprintf(_stderr,"FATAL: Incomplete data for Event ID = %d\n",(ulong)(uint)iVar1);
        exit(1);
      }
      fprintf(_stdout,"%d,%d,%f\n",(double)af.factor,(ulong)(uint)iVar1,
              (ulong)(uint)af.amplification_id);
      iVar3 = iVar3 + -1;
    }
  } while( true );
}

Assistant:

void DoIt() {

    size_t i = ReadOpts();

    event_count ec;
    amplification_factor af;

    fprintf(stdout, "event_id,amplification_id,factor\n");   // Header

    while (i = fread(&ec, sizeof(ec), 1, stdin) != 0) {

      for (int counter = 0; counter != ec.count; ++counter) {

        i = fread(&af, sizeof(af), 1, stdin);
	if (i == 0) {
	  fprintf(stderr, "FATAL: Incomplete data for Event ID = %d\n",
		  ec.event_id);
	  exit(EXIT_FAILURE);
	}

	fprintf(stdout, "%d,%d,%f\n", ec.event_id, af.amplification_id,
		af.factor);

      }

    }

  }